

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void printDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  long *plVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  Verbosity VVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ostream *poVar8;
  ostream **ppoVar9;
  long lVar10;
  Real RVar11;
  double dVar12;
  char cVar13;
  pointer pnVar14;
  NameSet *pNVar15;
  undefined8 uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  size_t sVar21;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar22;
  SPxOut *pSVar23;
  Verbosity old_verbosity_1;
  Verbosity VVar24;
  Verbosity old_verbosity;
  long lVar25;
  undefined7 in_register_00000081;
  char *pcVar26;
  long lVar27;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dual;
  Verbosity old_verbosity_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  redcost;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_3c0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  long local_398;
  long local_390;
  data_type local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined5 local_358;
  char cStack_353;
  char cStack_352;
  undefined6 uStack_351;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  NameSet *local_338;
  long local_330;
  undefined1 local_328 [16];
  pointer local_318;
  uint auStack_310 [2];
  uint local_308 [2];
  uint auStack_300 [2];
  uint local_2f8 [2];
  uint auStack_2f0 [2];
  uint local_2e8;
  bool local_2e4;
  fpclass_type local_2e0;
  int32_t iStack_2dc;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2d0;
  NameSet *local_2b8;
  SPxOut *local_2b0;
  data_type local_2a8;
  char local_293;
  char local_292;
  uint local_288;
  void *local_280;
  char local_273;
  char local_272;
  data_type local_268;
  char local_253;
  char local_252;
  uint local_248;
  void *local_240;
  char local_233;
  char local_232;
  data_type local_228;
  char local_213;
  char local_212;
  uint local_208;
  void *local_200;
  char local_1f3;
  char local_1f2;
  pointer local_1e8;
  pointer pnStack_1e0;
  pointer local_1d8;
  uint auStack_1d0 [2];
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  pointer local_1a8;
  pointer pnStack_1a0;
  pointer local_198;
  uint auStack_190 [2];
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [2];
  uint auStack_170 [2];
  pointer local_168;
  pointer pnStack_160;
  pointer local_158;
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [2];
  uint auStack_130 [2];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_330 = CONCAT44(local_330._4_4_,(int)CONCAT71(in_register_00000081,rational));
  pTVar6 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_338 = rownames;
  RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
  dVar12 = log10(RVar11);
  iVar18 = (int)-dVar12;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  iVar19 = iVar18 + 10;
  local_2b8 = colnames;
  if (real) {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&local_3c0,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar17 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkas(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_3c0);
    if (bVar17) {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar24;
      }
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_390 = (long)iVar19;
        local_398 = (long)iVar18;
        lVar25 = 9;
        lVar27 = 0;
        do {
          plVar1 = (long *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x48);
          local_168 = (pointer)*plVar1;
          pnStack_160 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x38);
          local_158 = *(pointer *)puVar2;
          auStack_150 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x28);
          local_148 = *(uint (*) [2])puVar2;
          auStack_140 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x18);
          local_138 = *(uint (*) [2])puVar2;
          auStack_130 = *(uint (*) [2])(puVar2 + 2);
          uVar4 = *(uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -8);
          bVar3 = *(byte *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -4);
          local_3a8 = ((local_3c0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar25];
          uStack_3a0 = 0;
          pTVar6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
          local_2f8[0] = local_138[0];
          local_2f8[1] = local_138[1];
          auStack_2f0[0] = auStack_130[0];
          auStack_2f0[1] = auStack_130[1];
          local_308[0] = local_148[0];
          local_308[1] = local_148[1];
          auStack_300[0] = auStack_140[0];
          auStack_300[1] = auStack_140[1];
          local_318 = local_158;
          auStack_310[0] = auStack_150[0];
          auStack_310[1] = auStack_150[1];
          local_328._0_8_ = local_168;
          uVar16 = local_328._0_8_;
          local_328._8_8_ = pnStack_160;
          local_2e0 = (fpclass_type)local_3a8;
          iStack_2dc = local_3a8._4_4_;
          local_2e4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_328._0_4_ = SUB84(local_168,0),
             local_328._0_4_ != 0 || (fpclass_type)local_3a8 != cpp_dec_float_finite)) {
            local_2e4 = (bool)(bVar3 ^ 1);
          }
          bVar17 = false;
          local_328._0_8_ = uVar16;
          local_2e8 = uVar4;
          if (((fpclass_type)local_3a8 != cpp_dec_float_NaN) && (!NAN(RVar11))) {
            local_340 = 0x1000000000;
            local_388.double_first = 0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = 0;
            cStack_353 = '\0';
            cStack_352 = '\0';
            uStack_351 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar11);
            iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_328,
                                (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
            bVar17 = 0 < iVar20;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((bVar17) && (VVar24 = (soplex->spxout).m_verbosity, 2 < (int)VVar24)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar8 = (soplex->spxout).m_streams[3];
            if (local_338->mem == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              pcVar26 = local_338->mem +
                        (local_338->set).theitem[(local_338->set).thekey[lVar27].idx].data;
              sVar21 = strlen(pcVar26);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar5 = (soplex->spxout).m_verbosity;
            ppoVar9 = (soplex->spxout).m_streams;
            poVar8 = ppoVar9[VVar5];
            lVar10 = *(long *)poVar8;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_390;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = local_398;
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x48);
            local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x38);
            local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x28);
            local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -0x18);
            local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
            local_88.m_backend.exp =
                 *(int *)((long)local_3c0.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -8);
            local_88.m_backend.neg =
                 *(bool *)((long)local_3c0.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar25 * 8 + -4);
            local_88.m_backend._72_8_ =
                 ((local_3c0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar25];
            boost::multiprecision::operator<<(ppoVar9[VVar5],&local_88);
            poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar13 = (char)poVar8;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar24;
          }
          lVar27 = lVar27 + 1;
          lVar25 = lVar25 + 10;
        } while (lVar27 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar24 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar25 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 1;
        lVar25 = *(long *)(lVar25 + -0x18);
        *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 0x100;
        pTVar6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
        std::ostream::_M_insert<double>(RVar11);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar25 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 8;
        lVar25 = *(long *)(lVar25 + -0x18);
        *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        (soplex->spxout).m_verbosity = VVar24;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 4) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0))))
            && (bVar17 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getDual(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)&local_3c0), bVar17)) {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar24;
      }
      pSVar22 = soplex->_realLP;
      if (0 < (pSVar22->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_390 = (long)iVar19;
        local_398 = (long)iVar18;
        lVar27 = 9;
        lVar25 = 0;
        do {
          plVar1 = (long *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x48);
          local_1a8 = (pointer)*plVar1;
          pnStack_1a0 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x38);
          local_198 = *(pointer *)puVar2;
          auStack_190 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x28);
          local_188 = *(uint (*) [2])puVar2;
          auStack_180 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x18);
          local_178 = *(uint (*) [2])puVar2;
          auStack_170 = *(uint (*) [2])(puVar2 + 2);
          uVar4 = *(uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -8);
          bVar3 = *(byte *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -4);
          local_3a8 = ((local_3c0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar27];
          uStack_3a0 = 0;
          pTVar6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
          local_2f8[0] = local_178[0];
          local_2f8[1] = local_178[1];
          auStack_2f0[0] = auStack_170[0];
          auStack_2f0[1] = auStack_170[1];
          local_308[0] = local_188[0];
          local_308[1] = local_188[1];
          auStack_300[0] = auStack_180[0];
          auStack_300[1] = auStack_180[1];
          local_318 = local_198;
          auStack_310[0] = auStack_190[0];
          auStack_310[1] = auStack_190[1];
          local_328._0_8_ = local_1a8;
          uVar16 = local_328._0_8_;
          local_328._8_8_ = pnStack_1a0;
          local_2e0 = (fpclass_type)local_3a8;
          iStack_2dc = local_3a8._4_4_;
          local_2e4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_328._0_4_ = SUB84(local_1a8,0),
             local_328._0_4_ != 0 || (fpclass_type)local_3a8 != cpp_dec_float_finite)) {
            local_2e4 = (bool)(bVar3 ^ 1);
          }
          bVar17 = false;
          local_328._0_8_ = uVar16;
          local_2e8 = uVar4;
          if (((fpclass_type)local_3a8 != cpp_dec_float_NaN) && (!NAN(RVar11))) {
            local_340 = 0x1000000000;
            local_388.double_first = 0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = 0;
            cStack_353 = '\0';
            cStack_352 = '\0';
            uStack_351 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar11);
            iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_328,
                                (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
            bVar17 = 0 < iVar20;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((bVar17) && (VVar24 = (soplex->spxout).m_verbosity, 2 < (int)VVar24)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar8 = (soplex->spxout).m_streams[3];
            if (local_338->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
            }
            else {
              pcVar26 = local_338->mem +
                        (local_338->set).theitem[(local_338->set).thekey[lVar25].idx].data;
              sVar21 = strlen(pcVar26);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar5 = (soplex->spxout).m_verbosity;
            ppoVar9 = (soplex->spxout).m_streams;
            poVar8 = ppoVar9[VVar5];
            lVar10 = *(long *)poVar8;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_390;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = local_398;
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x48);
            local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x38);
            local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x28);
            local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -0x18);
            local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
            local_d8.m_backend.exp =
                 *(int *)((long)local_3c0.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -8);
            local_d8.m_backend.neg =
                 *(bool *)((long)local_3c0.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -4);
            local_d8.m_backend._72_8_ =
                 ((local_3c0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar27];
            boost::multiprecision::operator<<(ppoVar9[VVar5],&local_d8);
            poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar13 = (char)poVar8;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar24;
          }
          lVar25 = lVar25 + 1;
          pSVar22 = soplex->_realLP;
          lVar27 = lVar27 + 10;
        } while (lVar25 < (pSVar22->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar24 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero (within ",0x27);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar25 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 1;
        lVar25 = *(long *)(lVar25 + -0x18);
        *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 0x100;
        pTVar6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
        std::ostream::_M_insert<double>(RVar11);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar25 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 8;
        lVar25 = *(long *)(lVar25 + -0x18);
        *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        (soplex->spxout).m_verbosity = VVar24;
        pSVar22 = soplex->_realLP;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase(&local_2d0,
                   (pSVar22->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar17 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCost(soplex,&local_2d0);
      if (bVar17) {
        pSVar23 = &soplex->spxout;
        VVar24 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar24) {
          (soplex->spxout).m_verbosity = INFO1;
          ::soplex::operator<<(pSVar23,"\nReduced costs (name, value):\n");
          (soplex->spxout).m_verbosity = VVar24;
        }
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          local_390 = (long)iVar19;
          local_398 = (long)iVar18;
          lVar27 = 9;
          lVar25 = 0;
          local_2b0 = pSVar23;
          do {
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar27 * 2 + -0x12;
            local_1e8 = *(pointer *)puVar2;
            pnStack_1e0 = *(pointer *)(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar27 * 2 + -0xe;
            local_1d8 = *(pointer *)puVar2;
            auStack_1d0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar27 * 2 + -10;
            local_1c8 = *(uint (*) [2])puVar2;
            auStack_1c0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar27 * 2 + -6;
            local_1b8 = *(uint (*) [2])puVar2;
            auStack_1b0 = *(uint (*) [2])(puVar2 + 2);
            uVar4 = ((local_2d0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                    [lVar27 * 2 + -2];
            bVar3 = (byte)((local_2d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                          [lVar27 * 2 + -1];
            local_3a8 = *(limb_type *)
                         (((local_2d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                         lVar27 * 2);
            uStack_3a0 = 0;
            pTVar6 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var7 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              }
            }
            RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
            local_2f8[0] = local_1b8[0];
            local_2f8[1] = local_1b8[1];
            auStack_2f0[0] = auStack_1b0[0];
            auStack_2f0[1] = auStack_1b0[1];
            local_308[0] = local_1c8[0];
            local_308[1] = local_1c8[1];
            auStack_300[0] = auStack_1c0[0];
            auStack_300[1] = auStack_1c0[1];
            local_318 = local_1d8;
            auStack_310[0] = auStack_1d0[0];
            auStack_310[1] = auStack_1d0[1];
            local_328._0_8_ = local_1e8;
            uVar16 = local_328._0_8_;
            local_328._8_8_ = pnStack_1e0;
            local_2e0 = (fpclass_type)local_3a8;
            iStack_2dc = local_3a8._4_4_;
            local_2e4 = (bool)bVar3;
            if ((bVar3 != 0) &&
               (local_328._0_4_ = SUB84(local_1e8,0),
               local_328._0_4_ != 0 || (fpclass_type)local_3a8 != cpp_dec_float_finite)) {
              local_2e4 = (bool)(bVar3 ^ 1);
            }
            bVar17 = false;
            local_328._0_8_ = uVar16;
            local_2e8 = uVar4;
            if (((fpclass_type)local_3a8 != cpp_dec_float_NaN) && (!NAN(RVar11))) {
              local_340 = 0x1000000000;
              local_388.double_first = 0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = 0;
              cStack_353 = '\0';
              cStack_352 = '\0';
              uStack_351 = 0;
              uStack_34b = 0;
              uStack_348 = 0;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar11);
              iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_328,
                                  (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
              bVar17 = 0 < iVar20;
            }
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if ((bVar17) && (VVar24 = (soplex->spxout).m_verbosity, 2 < (int)VVar24)) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar8 = (soplex->spxout).m_streams[3];
              if (local_2b8->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
              }
              else {
                pcVar26 = local_2b8->mem +
                          (local_2b8->set).theitem[(local_2b8->set).thekey[lVar25].idx].data;
                sVar21 = strlen(pcVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar5 = (soplex->spxout).m_verbosity;
              ppoVar9 = (soplex->spxout).m_streams;
              poVar8 = ppoVar9[VVar5];
              lVar10 = *(long *)poVar8;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_390;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = local_398;
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar27 * 2 + -0x12;
              local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar27 * 2 + -0xe;
              local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar27 * 2 + -10;
              local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar27 * 2 + -6;
              local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
              local_128.m_backend.exp =
                   ((local_2d0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                   [lVar27 * 2 + -2];
              local_128.m_backend.neg =
                   SUB41(((local_2d0.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                         [lVar27 * 2 + -1],0);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar27 * 2;
              local_128.m_backend.fpclass = puVar2[0];
              local_128.m_backend.prec_elem = puVar2[1];
              boost::multiprecision::operator<<(ppoVar9[VVar5],&local_128);
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar13 = (char)poVar8;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar24;
            }
            lVar25 = lVar25 + 1;
            lVar27 = lVar27 + 10;
          } while (lVar25 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
          VVar24 = (soplex->spxout).m_verbosity;
          pSVar23 = local_2b0;
        }
        if (2 < (int)VVar24) {
          (soplex->spxout).m_verbosity = INFO1;
          pSVar23 = ::soplex::operator<<(pSVar23,"All other reduced costs are zero (within ");
          poVar8 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar25 = *(long *)poVar8;
          *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 1;
          lVar25 = *(long *)(lVar25 + -0x18);
          *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 0x100
          ;
          pTVar6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
          std::ostream::_M_insert<double>(RVar11);
          poVar8 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar25 = *(long *)poVar8;
          *(undefined8 *)(poVar8 + *(long *)(lVar25 + -0x18) + 8) = 8;
          lVar25 = *(long *)(lVar25 + -0x18);
          *(uint *)(poVar8 + lVar25 + 0x18) = *(uint *)(poVar8 + lVar25 + 0x18) & 0xfffffefb | 4;
          pSVar23 = ::soplex::operator<<(pSVar23,").");
          std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          (soplex->spxout).m_verbosity = VVar24;
        }
      }
      if (local_2d0.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual information available.\n",0x1f);
        (soplex->spxout).m_verbosity = VVar24;
      }
    }
    if (local_3c0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3c0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_330 != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_328,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar17 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkasRational
                       (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)local_328);
    if (bVar17) {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar24;
      }
      pNVar15 = local_338;
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_330 = (long)iVar19;
        lVar25 = 0;
        lVar27 = 0;
        do {
          uVar16 = local_328._0_8_;
          local_3c0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3c0,(type *)0x0);
          iVar19 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar16)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar25),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar19 != 0) {
            VVar24 = (soplex->spxout).m_verbosity;
            local_3a8 = CONCAT44(local_3a8._4_4_,VVar24);
            if (2 < (int)VVar24) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar8 = (soplex->spxout).m_streams[3];
              if (pNVar15->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
              }
              else {
                pcVar26 = pNVar15->mem +
                          (pNVar15->set).theitem[(pNVar15->set).thekey[lVar27].idx].data;
                sVar21 = strlen(pcVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              lVar10 = *(long *)poVar8;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_330;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = (long)iVar18;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_228.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_328._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar25));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_228.ld);
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar13 = (char)poVar8;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              if ((local_1f3 == '\0') && (local_1f2 == '\0')) {
                operator_delete(local_200,(ulong)local_208 << 3);
              }
              if ((local_213 == '\0') && (local_212 == '\0')) {
                operator_delete(local_228.ld.data,(ulong)local_228.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (fpclass_type)local_3a8;
            }
          }
          lVar27 = lVar27 + 1;
          lVar25 = lVar25 + 0x40;
        } while (lVar27 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar24 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar24;
      }
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 4) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
       (bVar17 = ::soplex::
                 SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::getDualRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)local_328), bVar17)) {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar24;
      }
      pNVar15 = local_338;
      if (0 < (soplex->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .set.thenum) {
        lVar25 = 0;
        lVar27 = 0;
        do {
          uVar16 = local_328._0_8_;
          local_3c0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3c0,(type *)0x0);
          iVar18 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar16)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar25),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar18 != 0) {
            VVar24 = (soplex->spxout).m_verbosity;
            local_3a8 = CONCAT44(local_3a8._4_4_,VVar24);
            if (2 < (int)VVar24) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar8 = (soplex->spxout).m_streams[3];
              if (pNVar15->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
              }
              else {
                pcVar26 = pNVar15->mem +
                          (pNVar15->set).theitem[(pNVar15->set).thekey[lVar27].idx].data;
                sVar21 = strlen(pcVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_268.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_328._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar25));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_268.ld);
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar13 = (char)poVar8;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              if ((local_233 == '\0') && (local_232 == '\0')) {
                operator_delete(local_240,(ulong)local_248 << 3);
              }
              if ((local_253 == '\0') && (local_252 == '\0')) {
                operator_delete(local_268.ld.data,(ulong)local_268.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (fpclass_type)local_3a8;
            }
          }
          lVar27 = lVar27 + 1;
          lVar25 = lVar25 + 0x40;
        } while (lVar27 < (soplex->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
        VVar24 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero.",0x1f);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar24;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_3c0,
                   (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar17 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCostRational(soplex,(VectorRational *)&local_3c0);
      if (bVar17) {
        VVar24 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar24) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"\nReduced costs (name, value):\n",0x1e);
          (soplex->spxout).m_verbosity = VVar24;
        }
        pNVar15 = local_2b8;
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar25 = 0;
          lVar27 = 0;
          do {
            pnVar14 = local_3c0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_2d0.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_388.ld,(longlong *)&local_2d0,(type *)0x0);
            iVar18 = boost::multiprecision::backends::
                     rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(pnVar14->m_backend).m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar25),
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_388.ld);
            if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
              operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
            }
            if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
              operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
            }
            if ((iVar18 != 0) && (VVar24 = (soplex->spxout).m_verbosity, 2 < (int)VVar24)) {
              local_3a8 = CONCAT44(local_3a8._4_4_,VVar24);
              (soplex->spxout).m_verbosity = INFO1;
              poVar8 = (soplex->spxout).m_streams[3];
              if (pNVar15->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
              }
              else {
                pcVar26 = pNVar15->mem +
                          (pNVar15->set).theitem[(pNVar15->set).thekey[lVar27].idx].data;
                sVar21 = strlen(pcVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar26,sVar21);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_2a8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&((local_3c0.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                            .m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar25));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_2a8.ld);
              VVar24 = (fpclass_type)local_3a8;
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar13 = (char)poVar8;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              if ((local_273 == '\0') && (local_272 == '\0')) {
                operator_delete(local_280,(ulong)local_288 << 3);
              }
              if ((local_293 == '\0') && (local_292 == '\0')) {
                operator_delete(local_2a8.ld.data,(ulong)local_2a8.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = VVar24;
            }
            lVar27 = lVar27 + 1;
            lVar25 = lVar25 + 0x40;
          } while (lVar27 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
          VVar24 = (soplex->spxout).m_verbosity;
        }
        if (2 < (int)VVar24) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"All other reduced costs are zero.",0x21);
          poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar13 = (char)poVar8;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar24;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&local_3c0);
    }
    else {
      VVar24 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar24) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual (rational) solution available.\n",0x27);
        (soplex->spxout).m_verbosity = VVar24;
      }
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_328);
    return;
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}